

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_MeshInterface.cpp
# Opt level: O3

bool __thiscall
Opcode::MeshInterface::RemapClient(MeshInterface *this,udword nb_indices,udword *permutation)

{
  udword uVar1;
  uint uVar2;
  IndexedTriangle *pIVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  bVar9 = this->mNbTris == nb_indices;
  if (bVar9 && (permutation != (udword *)0x0 && nb_indices != 0)) {
    uVar8 = (ulong)nb_indices * 0xc + 8;
    pvVar4 = operator_new__(uVar8);
    uVar1 = this->mTriStride;
    pIVar3 = this->mTris;
    uVar5 = 0;
    lVar7 = 0;
    do {
      *(undefined4 *)((long)pvVar4 + lVar7 + 0x10) =
           *(undefined4 *)((long)pIVar3->mVRef + (ulong)uVar5 + 8);
      *(undefined8 *)((long)pvVar4 + lVar7 + 8) =
           *(undefined8 *)((long)pIVar3->mVRef + (ulong)uVar5);
      lVar7 = lVar7 + 0xc;
      uVar5 = uVar5 + uVar1;
    } while ((ulong)nb_indices * 0xc != lVar7);
    uVar5 = 0;
    uVar6 = 0;
    do {
      pIVar3 = this->mTris;
      uVar2 = permutation[uVar6];
      *(undefined4 *)((long)pIVar3->mVRef + (ulong)uVar5 + 8) =
           *(undefined4 *)((long)pvVar4 + (ulong)uVar2 * 0xc + 0x10);
      *(undefined8 *)((long)pIVar3->mVRef + (ulong)uVar5) =
           *(undefined8 *)((long)pvVar4 + (ulong)uVar2 * 0xc + 8);
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + uVar1;
    } while (uVar6 < this->mNbTris);
    operator_delete__(pvVar4,uVar8);
  }
  return bVar9 && (permutation != (udword *)0x0 && nb_indices != 0);
}

Assistant:

bool MeshInterface::RemapClient(udword nb_indices, const udword* permutation) const
{
	// Checkings
	if(!nb_indices || !permutation)	return false;
	if(nb_indices!=mNbTris)			return false;

#ifdef OPC_USE_CALLBACKS
	// We can't really do that using callbacks
	return false;
#else
	IndexedTriangle* Tmp = new IndexedTriangle[mNbTris];
	CHECKALLOC(Tmp);

	#ifdef OPC_USE_STRIDE
	udword Stride = mTriStride;
	#else
	udword Stride = sizeof(IndexedTriangle);
	#endif

	for(udword i=0;i<mNbTris;i++)
	{
		const IndexedTriangle* T = (const IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		Tmp[i] = *T;
	}

	for(udword i=0;i<mNbTris;i++)
	{
		IndexedTriangle* T = (IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		*T = Tmp[permutation[i]];
	}

	DELETEARRAY(Tmp);
#endif
	return true;
}